

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

void wal_delete_compact_upto_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  uint uVar4;
  char *__format;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  size_t valuelen;
  void *value;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_kvs_info kvs_info;
  char keybuf [256];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.wal_threshold = 0x13;
  fconfig.flags = 1;
  fdb_open(&dbfile,"./compact_test5",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  uVar4 = 0;
  while (uVar4 != 10) {
    sprintf(keybuf,"key%d",(ulong)uVar4);
    pfVar1 = db;
    sVar3 = strlen(keybuf);
    fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3,"value",5);
    uVar4 = uVar4 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xa62);
      wal_delete_compact_upto_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xa62,"void wal_delete_compact_upto_test()");
    }
  }
  fVar2 = fdb_commit(dbfile,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xa66);
    wal_delete_compact_upto_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xa66,"void wal_delete_compact_upto_test()");
  }
  uVar4 = 10;
  while (uVar4 != 0x14) {
    sprintf(keybuf,"key%d",(ulong)uVar4);
    pfVar1 = db;
    sVar3 = strlen(keybuf);
    fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3,"value",5);
    uVar4 = uVar4 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xa6d);
      wal_delete_compact_upto_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xa6d,"void wal_delete_compact_upto_test()");
    }
  }
  uVar4 = 0xf;
  while (uVar4 != 0x14) {
    sprintf(keybuf,"key%d",(ulong)uVar4);
    pfVar1 = db;
    sVar3 = strlen(keybuf);
    fVar2 = fdb_del_kv(pfVar1,keybuf,sVar3);
    uVar4 = uVar4 + 1;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xa73);
      wal_delete_compact_upto_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xa73,"void wal_delete_compact_upto_test()");
    }
  }
  fVar2 = fdb_commit(dbfile,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xa77);
    wal_delete_compact_upto_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xa77,"void wal_delete_compact_upto_test()");
  }
  sprintf(keybuf,"key%d",0x14);
  pfVar1 = db;
  sVar3 = strlen(keybuf);
  fVar2 = fdb_set_kv(pfVar1,keybuf,sVar3,"value",5);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xa7d);
    wal_delete_compact_upto_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xa7d,"void wal_delete_compact_upto_test()");
  }
  fVar2 = fdb_commit(dbfile,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xa7f);
    wal_delete_compact_upto_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xa7f,"void wal_delete_compact_upto_test()");
  }
  fVar2 = fdb_get_all_snap_markers(dbfile,&markers,&num_markers);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xa84);
    wal_delete_compact_upto_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xa84,"void wal_delete_compact_upto_test()");
  }
  fVar2 = fdb_compact_upto(dbfile,(char *)0x0,markers[1].marker);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xa88);
    wal_delete_compact_upto_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xa88,"void wal_delete_compact_upto_test()");
  }
  fVar2 = fdb_free_snap_markers(markers,num_markers);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_get_kvs_info(db,&kvs_info);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xa8d);
      wal_delete_compact_upto_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xa8d,"void wal_delete_compact_upto_test()");
    }
    uVar4 = 0xf;
    do {
      if (uVar4 == 0x14) {
        fdb_kvs_close(db);
        fdb_close(dbfile);
        fdb_shutdown();
        memleak_end();
        __format = "%s PASSED\n";
        if (wal_delete_compact_upto_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"compact upto with wal deletes test");
        return;
      }
      sprintf(keybuf,"key%d",(ulong)uVar4);
      pfVar1 = db;
      sVar3 = strlen(keybuf);
      fVar2 = fdb_get_kv(pfVar1,keybuf,sVar3,&value,&valuelen);
      uVar4 = uVar4 + 1;
    } while (fVar2 == FDB_RESULT_KEY_NOT_FOUND);
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xa93);
    wal_delete_compact_upto_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xa93,"void wal_delete_compact_upto_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0xa8a);
  wal_delete_compact_upto_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xa8a,"void wal_delete_compact_upto_test()");
}

Assistant:

void wal_delete_compact_upto_test()
{
    TEST_INIT();
    memleak_start();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_snapshot_info_t *markers;
    fdb_status status;
    uint64_t num_markers;
    fdb_kvs_info kvs_info;
    char keybuf[256];
    void *value;
    size_t valuelen;

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 19;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // open db
    fdb_open(&dbfile, "./compact_test5", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // insert a few keys...
    for (i=0;i<10;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert keys such that last insert causes wal flush...
    for (; i<20;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // Now delete half of the newly inserted keys
    for (i = 15; i < 20; ++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_del_kv(db, keybuf, strlen(keybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // Now deleted items are in the unflushed wal..
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another header for compact_upto()
    sprintf(keybuf, "key%d", i);
    status = fdb_set_kv(db, keybuf, strlen(keybuf),
            (void*)"value", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Get all snap markers..
    status = fdb_get_all_snap_markers(dbfile, &markers,
                                      &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // compact upto the delete wal's marker...
    status = fdb_compact_upto(dbfile, NULL, markers[1].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Deleted items should not be found..
    for (i = 15; i < 20; ++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("compact upto with wal deletes test");
}